

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction.cpp
# Opt level: O2

DuckTransaction * duckdb::DuckTransaction::Get(ClientContext *context,Catalog *catalog)

{
  int iVar1;
  DuckTransaction *pDVar2;
  InternalException *this;
  allocator local_39;
  string local_38;
  
  pDVar2 = (DuckTransaction *)Transaction::Get(context,catalog);
  iVar1 = (*(pDVar2->super_Transaction)._vptr_Transaction[3])(pDVar2);
  if ((char)iVar1 != '\0') {
    return pDVar2;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"DuckTransaction::Get called on non-DuckDB transaction",&local_39);
  InternalException::InternalException(this,&local_38);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

DuckTransaction &DuckTransaction::Get(ClientContext &context, Catalog &catalog) {
	auto &transaction = Transaction::Get(context, catalog);
	if (!transaction.IsDuckTransaction()) {
		throw InternalException("DuckTransaction::Get called on non-DuckDB transaction");
	}
	return transaction.Cast<DuckTransaction>();
}